

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstantsTests.cpp
# Opt level: O2

void __thiscall ConstantsTest_Values_Test<float>::TestBody(ConstantsTest_Values_Test<float> *this)

{
  char *pcVar1;
  AssertHelper local_30;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  AssertionResult gtest_ar;
  
  local_28.ptr_._0_4_ = 0x40490fdb;
  local_30.data_._0_4_ = 0x40490fdb;
  testing::internal::CmpHelperEQ<float,float>
            ((internal *)&gtest_ar,"static_cast<TypeParam>(constants::pi)",
             "Constants<TypeParam>::pi()",(float *)&local_28,(float *)&local_30);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_28);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_30,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/math/ConstantsTests.cpp"
               ,0x13,pcVar1);
    testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_28);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    local_28.ptr_._0_4_ = 0x50df5ce0;
    local_30.data_._0_4_ = 0x50df5ce0;
    testing::internal::CmpHelperEQ<float,float>
              ((internal *)&gtest_ar,"static_cast<TypeParam>(constants::c)",
               "Constants<TypeParam>::c()",(float *)&local_28,(float *)&local_30);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_28);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_30,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/math/ConstantsTests.cpp"
                 ,0x14,pcVar1);
      testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_28);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      local_28.ptr_._0_4_ = 0x50df5ce0;
      local_30.data_._0_4_ = 0x50df5ce0;
      testing::internal::CmpHelperEQ<float,float>
                ((internal *)&gtest_ar,"static_cast<TypeParam>(constants::lightVelocity)",
                 "Constants<TypeParam>::lightVelocity()",(float *)&local_28,(float *)&local_30);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_28);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar1 = "";
        }
        else {
          pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_30,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/math/ConstantsTests.cpp"
                   ,0x15,pcVar1);
        testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_28);
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar.message_);
        local_28.ptr_._0_4_ = 0xb004078c;
        local_30.data_._0_4_ = 0xb004078c;
        testing::internal::CmpHelperEQ<float,float>
                  ((internal *)&gtest_ar,"static_cast<TypeParam>(constants::electronCharge)",
                   "Constants<TypeParam>::electronCharge()",(float *)&local_28,(float *)&local_30);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&local_28);
          if (gtest_ar.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar1 = "";
          }
          else {
            pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_30,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/math/ConstantsTests.cpp"
                     ,0x16,pcVar1);
          testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_28);
        }
        else {
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&gtest_ar.message_);
          local_28.ptr_._0_4_ = 0x1290580b;
          local_30.data_._0_4_ = 0x1290580b;
          testing::internal::CmpHelperEQ<float,float>
                    ((internal *)&gtest_ar,"static_cast<TypeParam>(constants::electronMass)",
                     "Constants<TypeParam>::electronMass()",(float *)&local_28,(float *)&local_30);
          if (gtest_ar.success_ == false) {
            testing::Message::Message((Message *)&local_28);
            if (gtest_ar.message_.ptr_ ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar1 = "";
            }
            else {
              pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_30,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/math/ConstantsTests.cpp"
                       ,0x17,pcVar1);
            testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_28);
          }
          else {
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr(&gtest_ar.message_);
            local_28.ptr_._0_4_ = 0x180169b6;
            local_30.data_._0_4_ = 0x180169b6;
            testing::internal::CmpHelperEQ<float,float>
                      ((internal *)&gtest_ar,"static_cast<TypeParam>(constants::protonMass)",
                       "Constants<TypeParam>::protonMass()",(float *)&local_28,(float *)&local_30);
            if (gtest_ar.success_ == false) {
              testing::Message::Message((Message *)&local_28);
              if (gtest_ar.message_.ptr_ ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar1 = "";
              }
              else {
                pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_30,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/math/ConstantsTests.cpp"
                         ,0x18,pcVar1);
              testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_28);
            }
            else {
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~scoped_ptr(&gtest_ar.message_);
              local_28.ptr_._0_4_ = 0x12a71a82;
              local_30.data_._0_4_ = 0x12a71a82;
              testing::internal::CmpHelperEQ<float,float>
                        ((internal *)&gtest_ar,"static_cast<TypeParam>(constants::planck)",
                         "Constants<TypeParam>::planck()",(float *)&local_28,(float *)&local_30);
              if (gtest_ar.success_ == false) {
                testing::Message::Message((Message *)&local_28);
                if (gtest_ar.message_.ptr_ ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar1 = "";
                }
                else {
                  pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_30,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/math/ConstantsTests.cpp"
                           ,0x19,pcVar1);
                testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_28);
              }
              else {
                testing::internal::
                scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~scoped_ptr(&gtest_ar.message_);
                local_28.ptr_._0_4_ = 0x2be17c7f;
                local_30.data_._0_4_ = 0x2be17c7f;
                testing::internal::CmpHelperEQ<float,float>
                          ((internal *)&gtest_ar,"static_cast<TypeParam>(constants::eV)",
                           "Constants<TypeParam>::eV()",(float *)&local_28,(float *)&local_30);
                if (gtest_ar.success_ != false) {
                  testing::internal::
                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::~scoped_ptr(&gtest_ar.message_);
                  local_28.ptr_._0_4_ = 0x35d70a5e;
                  local_30.data_._0_4_ = 0x35d70a5e;
                  testing::internal::CmpHelperEQ<float,float>
                            ((internal *)&gtest_ar,"static_cast<TypeParam>(constants::meV)",
                             "Constants<TypeParam>::meV()",(float *)&local_28,(float *)&local_30);
                  if (gtest_ar.success_ == false) {
                    testing::Message::Message((Message *)&local_28);
                    if (gtest_ar.message_.ptr_ ==
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      pcVar1 = "";
                    }
                    else {
                      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              (&local_30,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/math/ConstantsTests.cpp"
                               ,0x1b,pcVar1);
                    testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_28);
                    testing::internal::AssertHelper::~AssertHelper(&local_30);
                    testing::internal::
                    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::~scoped_ptr(&local_28);
                  }
                  goto LAB_00184ad0;
                }
                testing::Message::Message((Message *)&local_28);
                if (gtest_ar.message_.ptr_ ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar1 = "";
                }
                else {
                  pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_30,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/math/ConstantsTests.cpp"
                           ,0x1a,pcVar1);
                testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_28);
              }
            }
          }
        }
      }
    }
  }
  testing::internal::AssertHelper::~AssertHelper(&local_30);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&local_28);
LAB_00184ad0:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TYPED_TEST(ConstantsTest, Values)
{
    // Check that all members of Constants<T> can be instantiated for all T in types
    // and are the same as casted corresponding values of constants namespace
    ASSERT_EQ(static_cast<TypeParam>(constants::pi), Constants<TypeParam>::pi());
    ASSERT_EQ(static_cast<TypeParam>(constants::c), Constants<TypeParam>::c());
    ASSERT_EQ(static_cast<TypeParam>(constants::lightVelocity), Constants<TypeParam>::lightVelocity());
    ASSERT_EQ(static_cast<TypeParam>(constants::electronCharge), Constants<TypeParam>::electronCharge());
    ASSERT_EQ(static_cast<TypeParam>(constants::electronMass), Constants<TypeParam>::electronMass());
    ASSERT_EQ(static_cast<TypeParam>(constants::protonMass), Constants<TypeParam>::protonMass());
    ASSERT_EQ(static_cast<TypeParam>(constants::planck), Constants<TypeParam>::planck());
    ASSERT_EQ(static_cast<TypeParam>(constants::eV), Constants<TypeParam>::eV());
    ASSERT_EQ(static_cast<TypeParam>(constants::meV), Constants<TypeParam>::meV());
}